

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * AnalyzeYield(ExpressionContext *ctx,SynYield *syntax)

{
  ScopeData *pSVar1;
  bool bVar2;
  int iVar3;
  ScopeData *curr_1;
  ExprBase *pEVar4;
  undefined4 extraout_var;
  TypeFunction *pTVar5;
  undefined4 extraout_var_00;
  ExprBase *pEVar6;
  SynBase *pSVar7;
  FunctionData *pFVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _func_int **pp_Var9;
  TypeError *pTVar10;
  ScopeData *curr;
  char *msg;
  uint state;
  ExprBase *unaff_R13;
  TypeBase *pTVar11;
  undefined4 extraout_var_03;
  
  if (syntax->value == (SynBase *)0x0) {
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
    pEVar4 = (ExprBase *)CONCAT44(extraout_var,iVar3);
    pTVar11 = ctx->typeVoid;
    pEVar4->typeID = 2;
    pEVar4->source = &syntax->super_SynBase;
    pEVar4->type = pTVar11;
    pEVar4->next = (ExprBase *)0x0;
    pEVar4->listed = false;
    pEVar4->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248688;
  }
  else {
    pEVar4 = AnalyzeExpression(ctx,syntax->value);
  }
  if ((pEVar4->type != (TypeBase *)0x0) && (pEVar4->type->typeID == 0)) {
    for (pSVar1 = ctx->scope; (pSVar1 != (ScopeData *)0x0 && (pSVar1->ownerType == (TypeBase *)0x0))
        ; pSVar1 = pSVar1->scope) {
      pFVar8 = pSVar1->ownerFunction;
      if (pFVar8 != (FunctionData *)0x0) goto LAB_0017d2f6;
    }
    pFVar8 = (FunctionData *)0x0;
LAB_0017d2f6:
    if (pFVar8 != (FunctionData *)0x0) {
      pFVar8->hasExplicitReturn = true;
    }
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var_01,iVar3);
    pTVar11 = pEVar4->type;
    pEVar6->typeID = 0x1d;
    pEVar6->source = &syntax->super_SynBase;
    pEVar6->type = pTVar11;
    pEVar6->next = (ExprBase *)0x0;
    pEVar6->listed = false;
    pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248f88;
    pEVar6[1]._vptr_ExprBase = (_func_int **)pEVar4;
    *(undefined8 *)&pEVar6[1].typeID = 0;
    pEVar6[1].source = (SynBase *)0x0;
    *(undefined4 *)&pEVar6[1].type = 0;
    return pEVar6;
  }
  for (pSVar1 = ctx->scope; (pSVar1 != (ScopeData *)0x0 && (pSVar1->ownerType == (TypeBase *)0x0));
      pSVar1 = pSVar1->scope) {
    pFVar8 = pSVar1->ownerFunction;
    if (pFVar8 != (FunctionData *)0x0) goto LAB_0017d146;
  }
  pFVar8 = (FunctionData *)0x0;
LAB_0017d146:
  if (pFVar8 != (FunctionData *)0x0) {
    if (pFVar8->coroutine == false) {
      msg = "ERROR: yield can only be used inside a coroutine";
      goto LAB_0017d454;
    }
    pTVar11 = pFVar8->type->returnType;
    if (pTVar11 == ctx->typeAuto) {
      bVar2 = AssertValueExpression(ctx,&syntax->super_SynBase,pEVar4);
      if (!bVar2) {
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
        unaff_R13 = (ExprBase *)CONCAT44(extraout_var_02,iVar3);
        pTVar11 = ctx->typeVoid;
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
        pp_Var9 = (_func_int **)CONCAT44(extraout_var_03,iVar3);
        pSVar7 = pEVar4->source;
        pTVar10 = ExpressionContext::GetErrorType(ctx);
        *(undefined4 *)(pp_Var9 + 1) = 0;
        pp_Var9[2] = (_func_int *)pSVar7;
        pp_Var9[3] = (_func_int *)pTVar10;
        pp_Var9[4] = (_func_int *)0x0;
        *(undefined1 *)(pp_Var9 + 5) = 0;
        *pp_Var9 = (_func_int *)&PTR__ExprError_00248b28;
        pp_Var9[0xc] = (_func_int *)0x0;
        pp_Var9[6] = (_func_int *)(pp_Var9 + 8);
        pp_Var9[8] = (_func_int *)pEVar4;
        pp_Var9[7] = (_func_int *)0x400000002;
        pp_Var9[9] = (_func_int *)0x0;
        unaff_R13->typeID = 0x1c;
        unaff_R13->source = &syntax->super_SynBase;
        unaff_R13->type = pTVar11;
        unaff_R13->next = (ExprBase *)0x0;
        unaff_R13->listed = false;
        unaff_R13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248b60;
        unaff_R13[1]._vptr_ExprBase = pp_Var9;
        *(undefined8 *)&unaff_R13[1].typeID = 0;
        unaff_R13[1].source = (SynBase *)0x0;
        goto LAB_0017d424;
      }
      pTVar11 = pEVar4->type;
      pTVar5 = ExpressionContext::GetFunctionType
                         (ctx,&syntax->super_SynBase,pTVar11,pFVar8->type->arguments);
      pFVar8->type = pTVar5;
    }
    if ((pTVar11 == ctx->typeVoid) && (pEVar4->type != ctx->typeVoid)) {
      anon_unknown.dwarf_c6b42::Report
                (ctx,&syntax->super_SynBase,"ERROR: \'void\' function returning a value");
    }
    if ((pTVar11 != ctx->typeVoid) && (pEVar4->type == ctx->typeVoid)) {
      anon_unknown.dwarf_c6b42::Report
                (ctx,&syntax->super_SynBase,"ERROR: function must return a value of type \'%.*s\'",
                 (ulong)(uint)(*(int *)&(pTVar11->name).end - (int)(pTVar11->name).begin));
    }
    pEVar4 = CreateCast(ctx,&syntax->super_SynBase,pEVar4,pFVar8->type->returnType,false);
    pFVar8->hasExplicitReturn = true;
    state = pFVar8->yieldCount + 1;
    pFVar8->yieldCount = state;
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    unaff_R13 = (ExprBase *)CONCAT44(extraout_var_00,iVar3);
    pTVar11 = ctx->typeVoid;
    pEVar6 = CreateFunctionCoroutineStateUpdate(ctx,&syntax->super_SynBase,pFVar8,state);
    pSVar7 = (SynBase *)CreateArgumentUpvalueClose(ctx,&syntax->super_SynBase,pFVar8);
    unaff_R13->typeID = 0x1d;
    unaff_R13->source = &syntax->super_SynBase;
    unaff_R13->type = pTVar11;
    unaff_R13->next = (ExprBase *)0x0;
    unaff_R13->listed = false;
    unaff_R13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248f88;
    unaff_R13[1]._vptr_ExprBase = (_func_int **)pEVar4;
    *(ExprBase **)&unaff_R13[1].typeID = pEVar6;
    unaff_R13[1].source = pSVar7;
    *(uint *)&unaff_R13[1].type = state;
  }
LAB_0017d424:
  if (pFVar8 != (FunctionData *)0x0) {
    return unaff_R13;
  }
  msg = "ERROR: global yield is not allowed";
LAB_0017d454:
  anon_unknown.dwarf_c6b42::Stop(ctx,&syntax->super_SynBase,msg);
}

Assistant:

ExprBase* AnalyzeYield(ExpressionContext &ctx, SynYield *syntax)
{
	ExprBase *result = syntax->value ? AnalyzeExpression(ctx, syntax->value) : new (ctx.get<ExprVoid>()) ExprVoid(syntax, ctx.typeVoid);

	if(isType<TypeError>(result->type))
	{
		if(FunctionData *function = ctx.GetCurrentFunction(ctx.scope))
			function->hasExplicitReturn = true;

		return new (ctx.get<ExprYield>()) ExprYield(syntax, result->type, result, NULL, NULL, 0);
	}

	if(FunctionData *function = ctx.GetCurrentFunction(ctx.scope))
	{
		if(!function->coroutine)
			Stop(ctx, syntax, "ERROR: yield can only be used inside a coroutine");

		TypeBase *returnType = function->type->returnType;

		// If return type is auto, set it to type that is being returned
		if(returnType == ctx.typeAuto)
		{
			if(!AssertValueExpression(ctx, syntax, result))
				return new (ctx.get<ExprReturn>()) ExprReturn(syntax, ctx.typeVoid, new (ctx.get<ExprError>()) ExprError(result->source, ctx.GetErrorType(), result, NULL), NULL, NULL);

			returnType = result->type;

			function->type = ctx.GetFunctionType(syntax, returnType, function->type->arguments);
		}

		if(returnType == ctx.typeVoid && result->type != ctx.typeVoid)
			Report(ctx, syntax, "ERROR: 'void' function returning a value");
		if(returnType != ctx.typeVoid && result->type == ctx.typeVoid)
			Report(ctx, syntax, "ERROR: function must return a value of type '%.*s'", FMT_ISTR(returnType->name));

		result = CreateCast(ctx, syntax, result, function->type->returnType, false);

		function->hasExplicitReturn = true;

		// TODO: checked return value

		unsigned yieldId = ++function->yieldCount;

		return new (ctx.get<ExprYield>()) ExprYield(syntax, ctx.typeVoid, result, CreateFunctionCoroutineStateUpdate(ctx, syntax, function, yieldId), CreateArgumentUpvalueClose(ctx, syntax, function), yieldId);
	}

	Stop(ctx, syntax, "ERROR: global yield is not allowed");

	return NULL;
}